

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_bolelli_2018.h
# Opt level: O2

void __thiscall DRAG<TTA>::PerformLabeling(DRAG<TTA> *this)

{
  long lVar1;
  undefined8 uVar2;
  char cVar3;
  Mat1b *pMVar4;
  Mat1i *pMVar5;
  uint *puVar6;
  uint *puVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  uint uVar20;
  long lVar21;
  int r;
  ulong uVar22;
  long lVar23;
  ulong uVar24;
  uint local_d0;
  Size local_98;
  Mat local_90 [96];
  
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  lVar11 = (long)*(int *)&pMVar4->field_0x8;
  lVar21 = (long)*(int *)&pMVar4->field_0xc;
  local_98.height = (int)**(undefined8 **)&pMVar4->field_0x40;
  local_98.width = (int)((ulong)**(undefined8 **)&pMVar4->field_0x40 >> 0x20);
  cv::Mat_<int>::Mat_((Mat_<int> *)local_90,&local_98);
  cv::Mat::operator=(&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_)->super_Mat,
                     local_90);
  cv::Mat::~Mat(local_90);
  uVar2 = *(undefined8 *)&((this->super_Labeling2D<(Connectivity2D)8,_false>).img_)->field_0x8;
  TTA::Alloc((((int)((ulong)uVar2 >> 0x20) + 1) / 2) * (((int)uVar2 + 1) / 2) + 1);
  *TTA::rtable_ = 0;
  TTA::length_ = 1;
  for (uVar22 = 0; (long)uVar22 < lVar11; uVar22 = uVar22 + 2) {
    pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
    pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
    lVar14 = **(long **)&pMVar4->field_0x48;
    lVar23 = lVar14 * uVar22 + *(long *)&pMVar4->field_0x10;
    lVar16 = lVar23 - lVar14;
    lVar19 = lVar16 - lVar14;
    lVar14 = lVar14 + lVar23;
    lVar13 = **(long **)&pMVar5->field_0x48;
    lVar17 = lVar13 * uVar22 + *(long *)&pMVar5->field_0x10;
    lVar15 = lVar17 + lVar13 * -2;
    lVar13 = lVar19 + -1;
    uVar9 = uVar22 | 1;
    for (uVar24 = 0; (long)uVar24 < lVar21; uVar24 = uVar24 + 2) {
      if (*(char *)(lVar23 + uVar24) == '\0') {
        if (((long)uVar9 < lVar11) && (*(char *)(lVar14 + uVar24) != '\0')) {
          uVar12 = uVar24 | 1;
          if (((long)uVar12 < lVar21) && (*(char *)(lVar23 + uVar12) != '\0')) {
            uVar10 = 1;
            if (uVar24 != 0) {
              if (*(char *)((uVar24 - 1) + lVar23) != '\0') {
                if (uVar22 != 0) {
                  if (*(char *)(lVar16 + uVar12) == '\0') goto LAB_0011caf2;
                  goto LAB_0011c9df;
                }
                goto LAB_0011cf08;
              }
              uVar10 = uVar12;
              if (*(char *)(lVar14 + -1 + uVar24) == '\0') goto LAB_0011ca9a;
              if (uVar22 == 0) goto LAB_0011cf08;
              if (*(char *)(lVar16 + uVar12) == '\0') {
                if ((lVar21 <= (long)(uVar24 + 2)) || (*(char *)(lVar16 + uVar24 + 2) == '\0')) {
                  if (*(char *)(lVar16 + uVar24) == '\0') goto LAB_0011cf08;
                  cVar3 = *(char *)((uVar24 - 2) + lVar23);
                  goto joined_r0x0011cefd;
                }
                if (*(char *)(lVar19 + uVar12) == '\0') {
                  if (*(char *)(lVar16 + uVar24) != '\0') {
                    if (*(char *)(lVar23 + -2 + uVar24) == '\0') {
                      uVar8 = *(uint *)(lVar15 + uVar24 * 4);
                      goto LAB_0011cfa0;
                    }
                    if (*(char *)(lVar16 + -1 + uVar24) == '\0') goto LAB_0011cf2e;
                    goto LAB_0011cdda;
                  }
                  goto LAB_0011cb23;
                }
              }
              if (*(char *)((uVar24 - 2) + lVar23) == '\0') goto LAB_0011ce3d;
LAB_0011cb79:
              if (uVar24 != 0 && uVar22 != 0) {
                if (*(char *)(lVar16 + -1 + uVar24) != '\0') {
LAB_0011cd3e:
                  if (uVar22 != 0) {
                    if (*(char *)(lVar16 + uVar24) != '\0') goto LAB_0011cc99;
                    goto LAB_0011cbe9;
                  }
                  goto LAB_0011cd7e;
                }
LAB_0011cb9d:
                if (*(char *)(lVar16 + -2 + uVar24) != '\0') {
                  if (*(char *)(lVar13 + uVar24) != '\0') goto LAB_0011cd3e;
                  goto LAB_0011cd7e;
                }
              }
LAB_0011ce28:
              uVar8 = *(uint *)(lVar15 + uVar24 * 4);
              uVar18 = *(uint *)(lVar17 + (uVar24 - 2) * 4);
              goto LAB_0011ce46;
            }
LAB_0011ca9a:
            if (((uVar22 != 0) && ((long)uVar10 < lVar21)) && (*(char *)(lVar16 + uVar10) != '\0'))
            goto LAB_0011cc57;
            if ((uVar22 == 0) || (lVar21 <= (long)(uVar24 + 2))) {
              if (uVar22 == 0) goto LAB_0011ccec;
            }
            else if (*(char *)(lVar16 + uVar24 + 2) != '\0') {
              if (*(char *)(lVar16 + uVar24) == '\0') goto LAB_0011cde4;
              goto LAB_0011cc29;
            }
            if (*(char *)(lVar16 + uVar24) != '\0') goto LAB_0011cc57;
LAB_0011ccec:
            uVar8 = TTA::NewLabel();
            goto LAB_0011cf0d;
          }
          if ((uVar24 == 0) ||
             ((*(char *)((uVar24 - 1) + lVar14) == '\0' && (*(char *)(lVar23 + -1 + uVar24) == '\0')
              ))) {
            uVar8 = TTA::NewLabel();
          }
          else {
            uVar8 = *(uint *)(lVar17 + -8 + uVar24 * 4);
          }
          *(uint *)(lVar17 + uVar24 * 4) = uVar8;
        }
        else {
          uVar10 = uVar24 | 1;
          if ((long)uVar10 < lVar21) {
            if (*(char *)(lVar23 + uVar10) != '\0') goto LAB_0011ca9a;
            if ((lVar11 <= (long)uVar9) || (*(char *)(lVar14 + uVar10) == '\0')) goto LAB_0011ccbe;
            goto LAB_0011ccec;
          }
LAB_0011ccbe:
          *(undefined4 *)(lVar17 + uVar24 * 4) = 0;
        }
      }
      else {
        if (uVar24 == 0) {
LAB_0011cbbe:
          uVar10 = uVar24 | 1;
          if ((uVar22 == 0) || ((lVar21 <= (long)uVar10 || (*(char *)(lVar16 + uVar10) == '\0')))) {
            if (((long)uVar10 < lVar21) &&
               (((*(char *)(lVar23 + uVar10) != '\0' && (uVar22 != 0)) &&
                ((long)(uVar24 + 2) < lVar21)))) {
              if (*(char *)(lVar16 + uVar24 + 2) != '\0') {
                if (*(char *)(lVar16 + uVar24) == '\0') {
                  if ((uVar24 == 0) || (*(char *)(lVar16 + -1 + uVar24) == '\0')) {
LAB_0011cde4:
                    uVar8 = *(uint *)(lVar15 + 8 + uVar24 * 4);
                    goto LAB_0011cf0d;
                  }
                  if (*(char *)(lVar19 + uVar10) == '\0') goto LAB_0011cdda;
                  goto LAB_0011cbe9;
                }
LAB_0011cc29:
                if ((lVar21 <= (long)uVar10) || (*(char *)(lVar19 + uVar10) == '\0')) {
                  uVar8 = *(uint *)(lVar15 + uVar24 * 4);
                  goto LAB_0011cc3d;
                }
                goto LAB_0011cc57;
              }
            }
            else if (uVar22 == 0) goto LAB_0011ccec;
            if (*(char *)(lVar16 + uVar24) != '\0') goto LAB_0011cc57;
            if ((uVar22 == 0 || uVar24 == 0) || (*(char *)(lVar16 + -1 + uVar24) == '\0'))
            goto LAB_0011ccec;
          }
          else {
            if (((*(char *)(lVar16 + uVar24) != '\0') || (uVar24 == 0)) ||
               (*(char *)(lVar16 + -1 + uVar24) == '\0')) {
LAB_0011cc57:
              uVar8 = *(uint *)(lVar15 + uVar24 * 4);
              goto LAB_0011cf0d;
            }
LAB_0011cbe9:
            if (*(char *)(lVar19 + uVar24) == '\0') {
LAB_0011cd7e:
              uVar8 = *(uint *)(lVar15 + -8 + uVar24 * 4);
              goto LAB_0011cd83;
            }
          }
LAB_0011cc99:
          uVar8 = *(uint *)(lVar15 + -8 + uVar24 * 4);
        }
        else {
          if (*(char *)(lVar23 + -1 + uVar24) == '\0') {
            if ((lVar11 <= (long)uVar9) || (*(char *)(lVar14 + -1 + uVar24) == '\0'))
            goto LAB_0011cbbe;
            uVar10 = uVar24 | 1;
            if (((uVar22 == 0) || (lVar21 <= (long)uVar10)) || (*(char *)(lVar16 + uVar10) == '\0'))
            {
              if (((lVar21 <= (long)uVar10) || (*(char *)(lVar23 + uVar10) == '\0')) ||
                 ((uVar22 == 0 ||
                  ((lVar21 <= (long)(uVar24 + 2) || (*(char *)(lVar16 + uVar24 + 2) == '\0')))))) {
                if (uVar22 == 0) goto LAB_0011cf08;
                if (*(char *)(lVar16 + -1 + uVar24) == '\0') {
                  if (*(char *)(lVar16 + uVar24) == '\0') goto LAB_0011cf08;
                  if (*(char *)((uVar24 - 2) + lVar23) == '\0') goto LAB_0011ce3d;
                  goto LAB_0011ce01;
                }
                uVar8 = *(uint *)(lVar15 + -8 + uVar24 * 4);
                if (*(char *)(lVar23 + -2 + uVar24) == '\0') goto LAB_0011ce41;
LAB_0011ce1e:
                *(uint *)(lVar17 + uVar24 * 4) = uVar8;
                goto LAB_0011cf12;
              }
              if (*(char *)(lVar23 + -2 + uVar24) == '\0') {
                if (*(char *)(lVar16 + uVar24) == '\0') {
                  if (*(char *)(lVar16 + -1 + uVar24) != '\0') {
                    if (*(char *)(lVar19 + uVar10) != '\0') goto LAB_0011ce64;
                    uVar8 = *(uint *)(lVar15 + -8 + uVar24 * 4);
                    goto LAB_0011cfa0;
                  }
LAB_0011cb23:
                  uVar8 = *(uint *)(lVar15 + 8 + uVar24 * 4);
                }
                else {
                  uVar8 = *(uint *)(lVar15 + uVar24 * 4);
                  if (*(char *)(lVar19 + uVar10) == '\0') {
LAB_0011cfa0:
                    uVar18 = *(uint *)(lVar15 + 8 + uVar24 * 4);
                    goto LAB_0011cfa5;
                  }
                }
                goto LAB_0011ce41;
              }
              if (*(char *)(lVar16 + -1 + uVar24) == '\0') {
                if (*(char *)(lVar19 + uVar10) != '\0') goto LAB_0011cb9d;
                if (*(char *)(lVar16 + uVar24) == '\0') goto LAB_0011cb23;
LAB_0011cf2e:
                lVar1 = uVar24 - 2;
                if (((uVar24 == 0 || uVar22 == 0) || (*(char *)(lVar16 + lVar1) == '\0')) ||
                   (*(char *)(lVar13 + uVar24) == '\0')) {
                  uVar8 = TTA::Merge(*(uint *)(lVar15 + uVar24 * 4),
                                     *(uint *)(lVar15 + 8 + uVar24 * 4));
                  uVar18 = *(uint *)(lVar17 + lVar1 * 4);
                  goto LAB_0011ce46;
                }
                uVar8 = *(uint *)(lVar15 + lVar1 * 4);
              }
              else {
                if (*(char *)(lVar19 + uVar10) != '\0') goto LAB_0011cd3e;
LAB_0011cdda:
                uVar8 = *(uint *)(lVar15 + -8 + uVar24 * 4);
              }
LAB_0011cc3d:
              uVar18 = *(uint *)(lVar15 + 8 + uVar24 * 4);
            }
            else {
              if (*(char *)((uVar24 - 2) + lVar23) != '\0') goto LAB_0011cb79;
              if ((*(char *)(lVar16 + uVar24) != '\0') || (*(char *)(lVar16 + -1 + uVar24) == '\0'))
              goto LAB_0011ce3d;
LAB_0011ce64:
              if ((uVar22 != 0) && (*(char *)(lVar19 + uVar24) != '\0')) {
                uVar8 = *(uint *)(lVar15 + -8 + uVar24 * 4);
                goto LAB_0011ce41;
              }
              uVar8 = *(uint *)(lVar15 + -8 + uVar24 * 4);
              uVar18 = *(uint *)(lVar15 + uVar24 * 4);
LAB_0011cfa5:
              uVar8 = TTA::Merge(uVar8,uVar18);
              uVar18 = *(uint *)(lVar17 + -8 + uVar24 * 4);
            }
          }
          else {
            uVar10 = uVar24 | 1;
            if (((uVar22 == 0) || (lVar21 <= (long)uVar10)) || (*(char *)(lVar16 + uVar10) == '\0'))
            {
              if (((long)uVar10 < lVar21) && (*(char *)(lVar23 + uVar10) != '\0')) {
LAB_0011caf2:
                if ((uVar22 != 0) &&
                   (((long)(uVar24 + 2) < lVar21 && (*(char *)(lVar16 + uVar24 + 2) != '\0')))) {
                  if (*(char *)(lVar19 + 1 + uVar24) == '\0') goto LAB_0011cb23;
                  goto LAB_0011c9df;
                }
              }
LAB_0011cf08:
              uVar8 = *(uint *)(lVar17 + -8 + uVar24 * 4);
              goto LAB_0011cf0d;
            }
LAB_0011c9df:
            if (*(char *)(lVar16 + uVar24) != '\0') goto LAB_0011cc57;
            cVar3 = *(char *)(lVar19 + uVar24);
joined_r0x0011cefd:
            if (cVar3 == '\0') {
LAB_0011ce3d:
              uVar8 = *(uint *)(lVar15 + uVar24 * 4);
LAB_0011ce41:
              uVar18 = *(uint *)(lVar17 + -8 + uVar24 * 4);
              goto LAB_0011ce46;
            }
            if (uVar24 == 0 || uVar22 == 0) goto LAB_0011ce28;
            if (*(char *)(lVar16 + -1 + uVar24) != '\0') goto LAB_0011cc99;
LAB_0011ce01:
            if (*(char *)(lVar16 + -2 + uVar24) == '\0') goto LAB_0011ce28;
            uVar8 = *(uint *)(lVar15 + -8 + uVar24 * 4);
            if (*(char *)(lVar13 + uVar24) != '\0') goto LAB_0011ce1e;
LAB_0011cd83:
            uVar18 = *(uint *)(lVar15 + uVar24 * 4);
          }
LAB_0011ce46:
          uVar8 = TTA::Merge(uVar8,uVar18);
        }
LAB_0011cf0d:
        *(uint *)(lVar17 + uVar24 * 4) = uVar8;
      }
LAB_0011cf12:
    }
  }
  uVar8 = TTA::Flatten();
  (this->super_Labeling2D<(Connectivity2D)8,_false>).n_labels_ = uVar8;
  puVar6 = TTA::rtable_;
  pMVar4 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_;
  pMVar5 = (this->super_Labeling2D<(Connectivity2D)8,_false>).img_labels_;
  uVar8 = *(uint *)&pMVar5->field_0x8;
  local_d0 = *(uint *)&pMVar5->field_0xc & 0x80000001;
  uVar22 = (long)(int)*(uint *)&pMVar5->field_0xc & 0xfffffffffffffffe;
  lVar11 = 1;
  lVar21 = 0;
  do {
    puVar7 = TTA::rtable_;
    if ((long)((long)(int)uVar8 & 0xfffffffffffffffeU) <= lVar21) {
      if ((uVar8 & 0x80000001) == 1) {
        lVar13 = **(long **)&pMVar4->field_0x48 * lVar21 + *(long *)&pMVar4->field_0x10;
        lVar11 = lVar21 * **(long **)&pMVar5->field_0x48 + *(long *)&pMVar5->field_0x10;
        for (lVar21 = 0; lVar21 < (long)uVar22; lVar21 = lVar21 + 2) {
          lVar14 = (long)*(int *)(lVar11 + lVar21 * 4);
          if (lVar14 < 1) {
            *(undefined8 *)(lVar11 + lVar21 * 4) = 0;
          }
          else {
            uVar8 = puVar7[lVar14];
            uVar18 = uVar8;
            if (*(char *)(lVar13 + lVar21) == '\0') {
              uVar18 = 0;
            }
            *(uint *)(lVar11 + lVar21 * 4) = uVar18;
            if (*(char *)(lVar13 + 1 + lVar21) == '\0') {
              *(undefined4 *)(lVar11 + 4 + lVar21 * 4) = 0;
            }
            else {
              *(uint *)(lVar11 + 4 + lVar21 * 4) = uVar8;
            }
          }
        }
        if (local_d0 == 1) {
          lVar14 = (long)*(int *)(lVar11 + lVar21 * 4);
          uVar8 = 0;
          if ((0 < lVar14) && (uVar8 = 0, *(char *)(lVar21 + lVar13) != '\0')) {
            uVar8 = TTA::rtable_[lVar14];
          }
          *(uint *)(lVar11 + lVar21 * 4) = uVar8;
        }
      }
      TTA::Dealloc();
      return;
    }
    lVar13 = **(long **)&pMVar5->field_0x48;
    lVar17 = lVar13 * lVar21 + *(long *)&pMVar5->field_0x10;
    lVar16 = lVar13 * lVar11 + *(long *)&pMVar5->field_0x10;
    lVar15 = **(long **)&pMVar4->field_0x48 * lVar11 + *(long *)&pMVar4->field_0x10;
    lVar14 = **(long **)&pMVar4->field_0x48 * lVar21 + *(long *)&pMVar4->field_0x10;
    for (uVar9 = 0; (long)uVar9 < (long)uVar22; uVar9 = uVar9 + 2) {
      lVar19 = (long)*(int *)(lVar17 + uVar9 * 4);
      if (lVar19 < 1) {
        *(undefined8 *)(lVar17 + uVar9 * 4) = 0;
        uVar24 = uVar9 | 1;
        *(undefined4 *)(lVar16 + uVar9 * 4) = 0;
        uVar18 = 0;
      }
      else {
        uVar18 = puVar7[lVar19];
        uVar20 = uVar18;
        if (*(char *)(lVar14 + uVar9) == '\0') {
          uVar20 = 0;
        }
        *(uint *)(lVar17 + uVar9 * 4) = uVar20;
        uVar20 = uVar18;
        if (*(char *)(lVar14 + 1 + uVar9) == '\0') {
          uVar20 = 0;
        }
        uVar24 = uVar9 + 1;
        *(uint *)(lVar17 + 4 + uVar9 * 4) = uVar20;
        uVar20 = uVar18;
        if (*(char *)(lVar15 + uVar9) == '\0') {
          uVar20 = 0;
        }
        *(uint *)(lVar16 + uVar9 * 4) = uVar20;
        if (*(char *)(lVar15 + 1 + uVar9) == '\0') {
          uVar18 = 0;
        }
      }
      *(uint *)(lVar17 + lVar13 + uVar24 * 4) = uVar18;
    }
    if (local_d0 == 1) {
      lVar13 = (long)*(int *)(lVar17 + uVar9 * 4);
      if (lVar13 < 1) {
        *(undefined4 *)(lVar17 + uVar9 * 4) = 0;
      }
      else {
        uVar18 = puVar6[lVar13];
        uVar20 = uVar18;
        if (*(char *)(uVar9 + lVar14) == '\0') {
          uVar20 = 0;
        }
        *(uint *)(lVar17 + uVar9 * 4) = uVar20;
        if (*(char *)(uVar9 + lVar15) != '\0') {
          *(uint *)(lVar16 + uVar9 * 4) = uVar18;
          goto LAB_0011d11c;
        }
      }
      *(undefined4 *)(lVar16 + uVar9 * 4) = 0;
    }
LAB_0011d11c:
    lVar21 = lVar21 + 2;
    lVar11 = lVar11 + 2;
  } while( true );
}

Assistant:

void PerformLabeling()
    {
        const int h = img_.rows;
        const int w = img_.cols;

        img_labels_ = cv::Mat1i(img_.size()); // Memory allocation for the output image

        LabelsSolver::Alloc(UPPER_BOUND_8_CONNECTIVITY); // Memory allocation of the labels solver
        LabelsSolver::Setup(); // Labels solver initialization

                               // We work with 2x2 blocks
                               // +-+-+-+
                               // |P|Q|R|
                               // +-+-+-+
                               // |S|X|
                               // +-+-+

                               // The pixels are named as follows
                               // +---+---+---+
                               // |a b|c d|e f|
                               // |g h|i j|k l|
                               // +---+---+---+
                               // |m n|o p|
                               // |q r|s t|
                               // +---+---+

                               // Pixels a, f, l, q are not needed, since we need to understand the
                               // the connectivity between these blocks and those pixels only matter
                               // when considering the outer connectivities

                               // A bunch of defines used to check if the pixels are foreground,
                               // without going outside the image limits.

                               // First scan
        for (int r = 0; r < h; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_prev = (unsigned char *)(((char *)img_row) - img_.step.p[0]);
            const unsigned char* const img_row_prev_prev = (unsigned char *)(((char *)img_row_prev) - img_.step.p[0]);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_prev_prev = (unsigned *)(((char *)img_labels_row) - img_labels_.step.p[0] - img_labels_.step.p[0]);

            for (int c = 0; c < w; c += 2) {

#define CONDITION_B c-1>=0 && r-2>=0 && img_row_prev_prev[c-1]>0
#define CONDITION_C r-2>=0 && img_row_prev_prev[c]>0
#define CONDITION_D c+1<w && r-2>=0 && img_row_prev_prev[c+1]>0
#define CONDITION_E c+2<w && r-2>=0 && img_row_prev_prev[c+2]>0

#define CONDITION_G c-2>=0 && r-1>=0 && img_row_prev[c-2]>0
#define CONDITION_H c-1>=0 && r-1>=0 && img_row_prev[c-1]>0
#define CONDITION_I r-1>=0 && img_row_prev[c]>0
#define CONDITION_J c+1<w && r-1>=0 && img_row_prev[c+1]>0
#define CONDITION_K c+2<w && r-1>=0 && img_row_prev[c+2]>0

#define CONDITION_M c-2>=0 && img_row[c-2]>0
#define CONDITION_N c-1>=0 && img_row[c-1]>0
#define CONDITION_O img_row[c]>0
#define CONDITION_P c+1<w && img_row[c+1]>0

#define CONDITION_R c-1>=0 && r+1<h && img_row_fol[c-1]>0
#define CONDITION_S r+1<h && img_row_fol[c]>0
#define CONDITION_T c+1<w && r+1<h && img_row_fol[c+1]>0

                // Action 1: No action
#define ACTION_1 img_labels_row[c] = 0; continue; 
                // Action 2: New label (the block has foreground pixels and is not connected to anything else)
#define ACTION_2 img_labels_row[c] = LabelsSolver::NewLabel(); continue; 
                //Action 3: Assign label of block P
#define ACTION_3 img_labels_row[c] = img_labels_row_prev_prev[c - 2]; continue;
                // Action 4: Assign label of block Q 
#define ACTION_4 img_labels_row[c] = img_labels_row_prev_prev[c]; continue;
                // Action 5: Assign label of block R
#define ACTION_5 img_labels_row[c] = img_labels_row_prev_prev[c + 2]; continue;
                // Action 6: Assign label of block S
#define ACTION_6 img_labels_row[c] = img_labels_row[c - 2]; continue; 
                // Action 7: Merge labels of block P and Q
#define ACTION_7 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]); continue;
                //Action 8: Merge labels of block P and R
#define ACTION_8 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]); continue;
                // Action 9 Merge labels of block P and S
#define ACTION_9 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row[c - 2]); continue;
                // Action 10 Merge labels of block Q and R
#define ACTION_10 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]); continue;
                // Action 11: Merge labels of block Q and S
#define ACTION_11 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row[c - 2]); continue;
                // Action 12: Merge labels of block R and S
#define ACTION_12 img_labels_row[c] = LabelsSolver::Merge(img_labels_row_prev_prev[c + 2], img_labels_row[c - 2]); continue;
                // Action 13: not used
#define ACTION_13 
                // Action 14: Merge labels of block P, Q and S
#define ACTION_14 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c]), img_labels_row[c - 2]); continue;
                //Action 15: Merge labels of block P, R and S
#define ACTION_15 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c - 2], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;
                //Action 16: labels of block Q, R and S
#define ACTION_16 img_labels_row[c] = LabelsSolver::Merge(LabelsSolver::Merge(img_labels_row_prev_prev[c], img_labels_row_prev_prev[c + 2]), img_labels_row[c - 2]); continue;

#include "labeling_bolelli_2018_drag.inc.h"
            }
        }

        // Second scan
        n_labels_ = LabelsSolver::Flatten();

        int e_rows = img_labels_.rows & 0xfffffffe;
        bool o_rows = img_labels_.rows % 2 == 1;
        int e_cols = img_labels_.cols & 0xfffffffe;
        bool o_cols = img_labels_.cols % 2 == 1;

        int r = 0;
        for (; r < e_rows; r += 2) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            const unsigned char* const img_row_fol = (unsigned char *)(((char *)img_row) + img_.step.p[0]);

            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            unsigned* const img_labels_row_fol = (unsigned *)(((char *)img_labels_row) + img_labels_.step.p[0]);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                    if (img_row_fol[c + 1] > 0)
                        img_labels_row_fol[c + 1] = iLabel;
                    else
                        img_labels_row_fol[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                    img_labels_row_fol[c] = 0;
                    img_labels_row_fol[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row_fol[c] > 0)
                        img_labels_row_fol[c] = iLabel;
                    else
                        img_labels_row_fol[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row_fol[c] = 0;
                }
            }
        }
        // Last row if the number of rows is odd
        if (o_rows) {
            // Get rows pointer
            const unsigned char* const img_row = img_.ptr<unsigned char>(r);
            unsigned* const img_labels_row = img_labels_.ptr<unsigned>(r);
            int c = 0;
            for (; c < e_cols; c += 2) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                    if (img_row[c + 1] > 0)
                        img_labels_row[c + 1] = iLabel;
                    else
                        img_labels_row[c + 1] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                    img_labels_row[c + 1] = 0;
                }
            }
            // Last column if the number of columns is odd
            if (o_cols) {
                int iLabel = img_labels_row[c];
                if (iLabel > 0) {
                    iLabel = LabelsSolver::GetLabel(iLabel);
                    if (img_row[c] > 0)
                        img_labels_row[c] = iLabel;
                    else
                        img_labels_row[c] = 0;
                }
                else {
                    img_labels_row[c] = 0;
                }
            }
        }

        LabelsSolver::Dealloc();

#undef ACTION_1
#undef ACTION_2
#undef ACTION_3
#undef ACTION_4
#undef ACTION_5
#undef ACTION_6
#undef ACTION_7
#undef ACTION_8
#undef ACTION_9
#undef ACTION_10
#undef ACTION_11
#undef ACTION_12
#undef ACTION_13
#undef ACTION_14
#undef ACTION_15
#undef ACTION_16


#undef CONDITION_B
#undef CONDITION_C
#undef CONDITION_D
#undef CONDITION_E

#undef CONDITION_G
#undef CONDITION_H
#undef CONDITION_I
#undef CONDITION_J
#undef CONDITION_K

#undef CONDITION_M
#undef CONDITION_N
#undef CONDITION_O
#undef CONDITION_P

#undef CONDITION_R
#undef CONDITION_S
#undef CONDITION_T
    }